

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# srv_config.cxx
# Opt level: O1

bufptr __thiscall cornerstone::srv_config::serialize(srv_config *this)

{
  _Head_base<0UL,_cornerstone::buffer_*,_false> extraout_RDX;
  int32 *in_RSI;
  bufptr bVar1;
  
  buffer::alloc((buffer *)this,*(long *)(in_RSI + 4) + 5);
  buffer::put((buffer *)(this->endpoint_)._M_dataplus._M_p,*in_RSI);
  buffer::put((buffer *)(this->endpoint_)._M_dataplus._M_p,(string *)(in_RSI + 2));
  buffer::pos((buffer *)(this->endpoint_)._M_dataplus._M_p,0);
  bVar1._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<0UL,_cornerstone::buffer_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
  bVar1._M_t.super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
  super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>.
  super__Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)>.
  super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
       (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)this;
  return (bufptr)bVar1._M_t.
                 super___uniq_ptr_impl<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)>._M_t.
                 super__Tuple_impl<0UL,_cornerstone::buffer_*,_void_(*)(cornerstone::buffer_*)>;
}

Assistant:

bufptr srv_config::serialize() const
{
    bufptr buf = buffer::alloc(sz_int + endpoint_.length() + 1);
    buf->put(id_);
    buf->put(endpoint_);
    buf->pos(0);
    return buf;
}